

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  jpeg_decoder *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  uint idx;
  jpgd_block_t *p;
  int r;
  int s;
  int k;
  jpgd_status in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint num_bits;
  coeff_buf *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(int *)(in_RDI + 800) == 0) {
    this = (jpeg_decoder *)
           coeff_buf_getp((jpeg_decoder *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                          in_stack_ffffffffffffffd0);
    iVar4 = *(int *)(in_RDI + 0x234);
    while (iVar4 <= *(int *)(in_RDI + 0x238)) {
      num_bits = *(uint *)(in_RDI + 0x224 + (long)in_ESI * 4);
      if (7 < num_bits) {
        stop_decoding((jpeg_decoder *)CONCAT44(num_bits,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
      }
      uVar1 = huff_decode((jpeg_decoder *)CONCAT44(in_ESI,in_EDX),
                          (huff_tables *)CONCAT44(in_ECX,iVar4));
      iVar2 = (int)uVar1 >> 4;
      uVar1 = uVar1 & 0xf;
      if (uVar1 == 0) {
        if (iVar2 != 0xf) {
          *(int *)(in_RDI + 800) = 1 << ((byte)iVar2 & 0x1f);
          if (iVar2 != 0) {
            uVar3 = get_bits_no_markers(this,num_bits);
            *(uint *)(in_RDI + 800) = uVar3 + *(int *)(in_RDI + 800);
          }
          *(int *)(in_RDI + 800) = *(int *)(in_RDI + 800) + -1;
          return;
        }
        iVar2 = iVar4 + 0xf;
        if (0x3f < iVar2) {
          stop_decoding((jpeg_decoder *)CONCAT44(num_bits,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
        }
      }
      else {
        iVar2 = iVar2 + iVar4;
        if (0x3f < iVar2) {
          stop_decoding((jpeg_decoder *)CONCAT44(num_bits,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
        }
        in_stack_ffffffffffffffd0 = get_bits_no_markers(this,num_bits);
        if ((int)in_stack_ffffffffffffffd0 < *(int *)(s_extend_test + (long)(int)(uVar1 & 0xf) * 4))
        {
          in_stack_ffffffffffffffd0 =
               in_stack_ffffffffffffffd0 + *(int *)(s_extend_offset + (long)(int)(uVar1 & 0xf) * 4);
        }
        *(jpgd_block_t *)
         ((long)this->m_jmp_state[0].__jmpbuf + (long)*(int *)(g_ZAG + (long)iVar2 * 4) * 2) =
             (jpgd_block_t)
             (in_stack_ffffffffffffffd0 << ((byte)*(undefined4 *)(in_RDI + 0x23c) & 0x1f));
      }
      iVar4 = iVar2 + 1;
    }
  }
  else {
    *(int *)(in_RDI + 800) = *(int *)(in_RDI + 800) + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int k, s, r;

		if (pD->m_eob_run)
		{
			pD->m_eob_run--;
			return;
		}

		jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

		for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++)
		{
			unsigned int idx = pD->m_comp_ac_tab[component_id];
			if (idx >= JPGD_MAX_HUFF_TABLES)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

			r = s >> 4;
			s &= 15;

			if (s)
			{
				if ((k += r) > 63)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				r = pD->get_bits_no_markers(s);
				s = JPGD_HUFF_EXTEND(r, s);

				p[g_ZAG[k]] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
			}
			else
			{
				if (r == 15)
				{
					if ((k += 15) > 63)
						pD->stop_decoding(JPGD_DECODE_ERROR);
				}
				else
				{
					pD->m_eob_run = 1 << r;

					if (r)
						pD->m_eob_run += pD->get_bits_no_markers(r);

					pD->m_eob_run--;

					break;
				}
			}
		}
	}